

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeStrideCase::test
          (VertexAttributeStrideCase *this)

{
  TestLog *pTVar1;
  long lVar2;
  GLuint local_2b0 [2];
  GLuint vaos [2];
  GLuint buf;
  allocator<char> local_279;
  string local_278;
  ScopedLogSection local_258;
  ScopedLogSection section_1;
  GLint local_248;
  int ndx_1;
  StridePointerData pointers_1 [9];
  GLint local_168;
  int ndx;
  StridePointerData pointers [9];
  undefined1 local_88 [8];
  GLfloat vertexData [4];
  string local_70;
  allocator<char> local_39;
  string local_38;
  ScopedLogSection local_18;
  ScopedLogSection section;
  VertexAttributeStrideCase *this_local;
  
  pTVar1 = (this->super_ApiCase).m_log;
  section.m_log = (TestLog *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"DefaultVAO",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Test with default VAO",(allocator<char> *)((long)vertexData + 0xf)
            );
  tcu::ScopedLogSection::ScopedLogSection(&local_18,pTVar1,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)vertexData + 0xf));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  memset(local_88,0,0x10);
  local_168 = 1;
  ndx = 0x1406;
  pointers[0].size = 0;
  pointers[0]._8_8_ = local_88;
  pointers[0].pointer._0_4_ = 1;
  pointers[0].pointer._4_4_ = 0x1406;
  pointers[1].size = 1;
  pointers[1]._8_8_ = local_88;
  pointers[1].pointer._0_4_ = 1;
  pointers[1].pointer._4_4_ = 0x1406;
  pointers[2].size = 4;
  pointers[2]._8_8_ = local_88;
  pointers[2].pointer._0_4_ = 1;
  pointers[2].pointer._4_4_ = 0x140b;
  pointers[3].size = 0;
  pointers[3]._8_8_ = local_88;
  pointers[3].pointer._0_4_ = 1;
  pointers[3].pointer._4_4_ = 0x140b;
  pointers[4].size = 1;
  pointers[4]._8_8_ = local_88;
  pointers[4].pointer._0_4_ = 1;
  pointers[4].pointer._4_4_ = 0x140b;
  pointers[5].size = 4;
  pointers[5]._8_8_ = local_88;
  pointers[5].pointer._0_4_ = 1;
  pointers[5].pointer._4_4_ = 0x140c;
  pointers[6].size = 0;
  pointers[6]._8_8_ = local_88;
  pointers[6].pointer._0_4_ = 1;
  pointers[6].pointer._4_4_ = 0x140c;
  pointers[7].size = 1;
  pointers[7]._8_8_ = local_88;
  pointers[7].pointer._0_4_ = 1;
  pointers[7].pointer._4_4_ = 0x140c;
  pointers[8].size = 4;
  pointers[8]._8_8_ = local_88;
  for (pointers_1[8].pointer._4_4_ = 0; pointers_1[8].pointer._4_4_ < 9;
      pointers_1[8].pointer._4_4_ = pointers_1[8].pointer._4_4_ + 1) {
    lVar2 = (long)pointers_1[8].pointer._4_4_;
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_ApiCase).super_CallLogWrapper,0,(&local_168)[lVar2 * 6],
               *(GLenum *)((long)&pointers[lVar2 + -1].pointer + 4),'\0',pointers[lVar2].size,
               *(void **)&pointers[lVar2].stride);
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       &(this->super_ApiCase).super_CallLogWrapper,0,0x8624,
                       pointers[pointers_1[8].pointer._4_4_].size);
  }
  local_248 = 1;
  ndx_1 = 0x1404;
  pointers_1[0].size = 0;
  pointers_1[0]._8_8_ = local_88;
  pointers_1[0].pointer._0_4_ = 1;
  pointers_1[0].pointer._4_4_ = 0x1404;
  pointers_1[1].size = 1;
  pointers_1[1]._8_8_ = local_88;
  pointers_1[1].pointer._0_4_ = 1;
  pointers_1[1].pointer._4_4_ = 0x1404;
  pointers_1[2].size = 4;
  pointers_1[2]._8_8_ = local_88;
  pointers_1[2].pointer._0_4_ = 4;
  pointers_1[2].pointer._4_4_ = 0x1401;
  pointers_1[3].size = 0;
  pointers_1[3]._8_8_ = local_88;
  pointers_1[3].pointer._0_4_ = 4;
  pointers_1[3].pointer._4_4_ = 0x1401;
  pointers_1[4].size = 1;
  pointers_1[4]._8_8_ = local_88;
  pointers_1[4].pointer._0_4_ = 4;
  pointers_1[4].pointer._4_4_ = 0x1401;
  pointers_1[5].size = 4;
  pointers_1[5]._8_8_ = local_88;
  pointers_1[5].pointer._0_4_ = 2;
  pointers_1[5].pointer._4_4_ = 0x1402;
  pointers_1[6].size = 0;
  pointers_1[6]._8_8_ = local_88;
  pointers_1[6].pointer._0_4_ = 2;
  pointers_1[6].pointer._4_4_ = 0x1402;
  pointers_1[7].size = 1;
  pointers_1[7]._8_8_ = local_88;
  pointers_1[7].pointer._0_4_ = 2;
  pointers_1[7].pointer._4_4_ = 0x1402;
  pointers_1[8].size = 4;
  pointers_1[8]._8_8_ = local_88;
  for (section_1.m_log._4_4_ = 0; section_1.m_log._4_4_ < 9;
      section_1.m_log._4_4_ = section_1.m_log._4_4_ + 1) {
    lVar2 = (long)section_1.m_log._4_4_;
    glu::CallLogWrapper::glVertexAttribIPointer
              (&(this->super_ApiCase).super_CallLogWrapper,0,(&local_248)[lVar2 * 6],
               *(GLenum *)((long)&pointers_1[lVar2 + -1].pointer + 4),pointers_1[lVar2].size,
               *(void **)&pointers_1[lVar2].stride);
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       &(this->super_ApiCase).super_CallLogWrapper,0,0x8624,
                       pointers_1[section_1.m_log._4_4_].size);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_18);
  pTVar1 = (this->super_ApiCase).m_log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"WithVAO",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"Test with VAO",(allocator<char> *)((long)vaos + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar1,&local_278,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  std::allocator<char>::~allocator((allocator<char> *)((long)vaos + 7));
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  vaos[0] = 0;
  local_2b0[0] = 0;
  local_2b0[1] = 0;
  glu::CallLogWrapper::glGenVertexArrays(&(this->super_ApiCase).super_CallLogWrapper,2,local_2b0);
  glu::CallLogWrapper::glGenBuffers(&(this->super_ApiCase).super_CallLogWrapper,1,vaos);
  glu::CallLogWrapper::glBindBuffer(&(this->super_ApiCase).super_CallLogWrapper,0x8892,vaos[0]);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_ApiCase).super_CallLogWrapper,local_2b0[0]);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,0,0x8624,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_ApiCase).super_CallLogWrapper,0,1,0x1406,'\0',4,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_ApiCase).super_CallLogWrapper,local_2b0[1]);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_ApiCase).super_CallLogWrapper,0,1,0x1402,'\0',8,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,0,0x8624,8);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_ApiCase).super_CallLogWrapper,local_2b0[0]);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,0,0x8624,4);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(&(this->super_ApiCase).super_CallLogWrapper,2,local_2b0)
  ;
  glu::CallLogWrapper::glDeleteBuffers(&(this->super_ApiCase).super_CallLogWrapper,1,vaos);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_258);
  return;
}

Assistant:

void test (void)
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			const GLfloat vertexData[4] = {0.0f}; // never accessed

			struct StridePointerData
			{
				GLint		size;
				GLenum		type;
				GLint		stride;
				const void*	pointer;
			};

			// test VertexAttribPointer
			{
				const StridePointerData pointers[] =
				{
					{ 1, GL_FLOAT,			0,	vertexData },
					{ 1, GL_FLOAT,			1,	vertexData },
					{ 1, GL_FLOAT,			4,	vertexData },
					{ 1, GL_HALF_FLOAT,		0,	vertexData },
					{ 1, GL_HALF_FLOAT,		1,	vertexData },
					{ 1, GL_HALF_FLOAT,		4,	vertexData },
					{ 1, GL_FIXED,			0,	vertexData },
					{ 1, GL_FIXED,			1,	vertexData },
					{ 1, GL_FIXED,			4,	vertexData },
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, GL_FALSE, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, pointers[ndx].stride);
				}
			}

			// test glVertexAttribIPointer
			{
				const StridePointerData pointers[] =
				{
					{ 1, GL_INT,				0,	vertexData },
					{ 1, GL_INT,				1,	vertexData },
					{ 1, GL_INT,				4,	vertexData },
					{ 4, GL_UNSIGNED_BYTE,		0,	vertexData },
					{ 4, GL_UNSIGNED_BYTE,		1,	vertexData },
					{ 4, GL_UNSIGNED_BYTE,		4,	vertexData },
					{ 2, GL_SHORT,				0,	vertexData },
					{ 2, GL_SHORT,				1,	vertexData },
					{ 2, GL_SHORT,				4,	vertexData },
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribIPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, pointers[ndx].stride);
				}
			}
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint buf		= 0;
			GLuint vaos[2]	= {0};

			glGenVertexArrays(2, vaos);
			glGenBuffers(1, &buf);
			glBindBuffer(GL_ARRAY_BUFFER, buf);
			expectError(GL_NO_ERROR);

			// initial
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, 0);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glVertexAttribPointer(0, 1, GL_FLOAT, GL_FALSE, 4, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribPointer(0, 1, GL_SHORT, GL_FALSE, 8, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, 8);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, 4);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(1, &buf);
			expectError(GL_NO_ERROR);
		}
	}